

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-recover.c
# Opt level: O2

_Bool borg_recover(void)

{
  borg_item_conflict *pbVar1;
  _Bool _Var2;
  borg_need bVar3;
  wchar_t wVar4;
  uint32_t uVar5;
  wchar_t wVar6;
  char *pcVar7;
  keycode_t k;
  uint32_t uVar8;
  
  bVar3 = borg_maintain_light();
  if (bVar3 == BORG_MET_NEED) {
    return true;
  }
  if (bVar3 == BORG_UNMET_NEED) {
    pcVar7 = format("# Need to refuel but cant!");
    borg_note(pcVar7);
  }
  wVar4 = borg_danger(borg.c.y,borg.c.x,L'\x01',true,false);
  if (avoidance / 4 < wVar4) {
    return false;
  }
  uVar5 = Rand_div(100);
  uVar8 = uVar5 - 10;
  if (borg.trait[0x1c] / 2 <= borg.trait[0x1b]) {
    uVar8 = uVar5;
  }
  uVar5 = uVar8 - 10;
  if (borg.trait[0x1c] / 4 <= borg.trait[0x1b]) {
    uVar5 = uVar8;
  }
  if (((borg.trait[0x75] == 0) || (0x4a < (int)uVar5)) ||
     ((((_Var2 = borg_activate_item(act_cure_body), !_Var2 &&
        ((((_Var2 = borg_activate_item(act_cure_critical), !_Var2 &&
           (_Var2 = borg_activate_item(act_cure_full), !_Var2)) &&
          (_Var2 = borg_activate_item(act_cure_full2), !_Var2)) &&
         ((_Var2 = borg_activate_item(act_cure_temp), !_Var2 &&
          (_Var2 = borg_activate_item(act_heal3), !_Var2)))))) &&
       (_Var2 = borg_spell(MINOR_HEALING), !_Var2)) &&
      (((_Var2 = borg_spell(HEALING), !_Var2 && (_Var2 = borg_spell(HERBAL_CURING), !_Var2)) &&
       (_Var2 = borg_spell(HOLY_WORD), !_Var2)))))) {
    if ((borg.trait[0x76] == 0) ||
       ((((((_Var2 = borg_eat(L'\x1d',sv_mush_fast_recovery), !_Var2 &&
            (_Var2 = borg_activate_item(act_cure_body), !_Var2)) &&
           (_Var2 = borg_activate_item(act_cure_critical), !_Var2)) &&
          ((_Var2 = borg_activate_item(act_cure_full), !_Var2 &&
           (_Var2 = borg_activate_item(act_cure_full2), !_Var2)))) &&
         ((_Var2 = borg_activate_item(act_cure_temp), !_Var2 &&
          ((_Var2 = borg_activate_item(act_heal3), !_Var2 &&
           (_Var2 = borg_spell(MINOR_HEALING), !_Var2)))))) &&
        ((_Var2 = borg_spell(HEALING), !_Var2 &&
         ((_Var2 = borg_spell(HERBAL_CURING), !_Var2 && (_Var2 = borg_spell(HOLY_WORD), !_Var2))))))
       )) {
      if (((borg.trait[0x74] == 0) || (0x4a < (int)uVar5)) ||
         (((_Var2 = borg_activate_item(act_cure_light), !_Var2 &&
           (((_Var2 = borg_spell(MINOR_HEALING), !_Var2 && (_Var2 = borg_spell(HEALING), !_Var2)) &&
            (_Var2 = borg_spell(HERBAL_CURING), !_Var2)))) &&
          (_Var2 = borg_spell(HOLY_WORD), !_Var2)))) {
        if (((borg.trait[0x73] == 0) || (0x4a < (int)uVar5)) ||
           (((_Var2 = borg_eat(L'\x1d',sv_mush_fast_recovery), !_Var2 &&
             ((_Var2 = borg_activate_item(act_rem_fear_pois), !_Var2 &&
              (_Var2 = borg_spell(HERBAL_CURING), !_Var2)))) &&
            (_Var2 = borg_spell(CURE_POISON), !_Var2)))) {
          if ((((borg.trait[0x71] == 0) || (borg.trait[0xba] != 0)) || (0x4a < (int)uVar5)) ||
             (((_Var2 = borg_eat(L'\x1d',sv_mush_cure_mind), !_Var2 &&
               (_Var2 = borg_activate_item(act_rem_fear_pois), !_Var2)) &&
              ((_Var2 = borg_spell(HEROISM), !_Var2 &&
               ((_Var2 = borg_spell(BERSERK_STRENGTH), !_Var2 &&
                (_Var2 = borg_spell(HOLY_WORD), !_Var2)))))))) {
            if (borg.trait[0x6d] == 0) {
              if ((borg.trait[0x6c] != 0) && ((int)uVar5 < 0x4b)) {
LAB_0022b3a8:
                _Var2 = borg_spell(REMOVE_HUNGER);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_spell(HERBAL_CURING);
                if (_Var2) {
                  return true;
                }
              }
              if (((borg.trait[0x78] != 0) && ((int)uVar5 < 0x4b)) &&
                 (_Var2 = borg_eat(L'\x1d',sv_mush_cure_mind), _Var2)) {
                return true;
              }
            }
            else if ((int)uVar5 < 0x4b) goto LAB_0022b3a8;
            if ((((wVar4 == L'\0') && (borg.trait[0x1b] < borg.trait[0x1c] / 2)) &&
                (((int)uVar5 < 0x4b && (borg.trait[0x1f] / 4 < borg.trait[0x1e])))) &&
               (((_Var2 = borg_activate_item(act_heal1), _Var2 ||
                 (_Var2 = borg_activate_item(act_heal2), _Var2)) ||
                ((_Var2 = borg_activate_item(act_heal3), _Var2 ||
                 ((((_Var2 = borg_spell(HEALING), _Var2 || (_Var2 = borg_spell(HOLY_WORD), _Var2))
                   || (_Var2 = borg_spell(MINOR_HEALING), _Var2)) ||
                  (_Var2 = borg_spell(HEROISM), _Var2)))))))) {
              pcVar7 = "# heal damage (recovering)";
            }
            else {
              if (borg.trait[0x7d] != 0) {
                _Var2 = borg_activate_item(act_restore_exp);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_activate_item(act_restore_st_lev);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_activate_item(act_restore_life);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_spell(REVITALIZE);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_spell(REMEMBRANCE);
                if (_Var2) {
                  return true;
                }
                if ((0x5a < borg.trait[0x1b]) && (_Var2 = borg_spell(UNHOLY_REPRIEVE), _Var2)) {
                  return true;
                }
              }
              if (((borg.trait[0x7f] == 0) && (borg.trait[0x80] == 0)) &&
                 ((borg.trait[0x81] == 0 &&
                  (((borg.trait[0x82] == 0 && (borg.trait[0x83] == 0)) && (borg.trait[0x84] == 0))))
                 )) {
LAB_0022b4fb:
                if ((borg.trait[0x80] != 0) || (borg.trait[0x83] != 0)) goto LAB_0022b50d;
              }
              else {
                _Var2 = borg_spell(RESTORATION);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_spell(REVITALIZE);
                if (_Var2) {
                  return true;
                }
                if (borg.trait[0x7f] == 0) goto LAB_0022b4fb;
LAB_0022b50d:
                if ((0x5a < borg.trait[0x1b]) && (_Var2 = borg_spell(UNHOLY_REPRIEVE), _Var2)) {
                  return true;
                }
              }
              if ((borg.trait[0x75] != 0) && ((int)uVar5 < 0x19)) {
                _Var2 = borg_use_staff_fail(sv_staff_curing);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_zap_rod(sv_rod_curing);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_zap_rod(sv_rod_healing);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_activate_item(act_heal1);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_activate_item(act_heal2);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_quaff_crit(false);
                if (_Var2) {
                  return true;
                }
              }
              if ((borg.trait[0x76] != 0) && ((int)uVar5 < 0x5f)) {
                _Var2 = borg_quaff_crit(true);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_use_staff_fail(sv_staff_curing);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_zap_rod(sv_rod_curing);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_zap_rod(sv_rod_healing);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_activate_item(act_heal1);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_activate_item(act_heal2);
                if (_Var2) {
                  return true;
                }
              }
              if ((borg.trait[0x74] != 0) && ((int)uVar5 < 0x19)) {
                _Var2 = borg_use_staff_fail(sv_staff_curing);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_zap_rod(sv_rod_curing);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_zap_rod(sv_rod_healing);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_activate_item(act_heal1);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_activate_item(act_heal2);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_quaff_crit(borg.trait[0x1b] < 10);
                if (_Var2) {
                  return true;
                }
              }
              if ((borg.trait[0x73] != 0) && ((int)uVar5 < 0x19)) {
                _Var2 = borg_eat(L'\x1d',sv_mush_fast_recovery);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_quaff_potion(sv_potion_cure_poison);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_eat(L'\x1c',sv_food_waybread);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_eat(L'\x1d',sv_mush_fast_recovery);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_quaff_crit(borg.trait[0x1b] < 10);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_use_staff_fail(sv_staff_curing);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_zap_rod(sv_rod_curing);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_activate_item(act_rem_fear_pois);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_activate_item(act_food_waybread);
                if (_Var2) {
                  return true;
                }
              }
              if ((borg.trait[0x70] != 0) && ((int)uVar5 < 0x19)) {
                _Var2 = borg_eat(L'\x1d',sv_mush_fast_recovery);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_eat(L'\x1c',sv_food_waybread);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_quaff_potion(sv_potion_cure_light);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_quaff_potion(sv_potion_cure_serious);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_quaff_crit(false);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_use_staff_fail(sv_staff_curing);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_zap_rod(sv_rod_curing);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_activate_item(act_food_waybread);
                if (_Var2) {
                  return true;
                }
              }
              if ((borg.trait[0x72] != 0) && ((int)uVar5 < 0x19)) {
                _Var2 = borg_eat(L'\x1d',sv_mush_cure_mind);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_quaff_potion(sv_potion_cure_serious);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_quaff_crit(false);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_use_staff_fail(sv_staff_curing);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_activate_item(act_cure_confusion);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_zap_rod(sv_rod_curing);
                if (_Var2) {
                  return true;
                }
              }
              if (((borg.trait[0x71] != 0) && (borg.trait[0xba] == 0)) && ((int)uVar5 < 0x19)) {
                _Var2 = borg_eat(L'\x1d',sv_mush_cure_mind);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_quaff_potion(sv_potion_boldness);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_quaff_potion(sv_potion_heroism);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_quaff_potion(sv_potion_berserk);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_activate_item(act_rem_fear_pois);
                if (_Var2) {
                  return true;
                }
              }
              if (((borg.trait[0x6d] != 0) || (borg.trait[0x6c] != 0)) && ((int)uVar5 < 0x19)) {
                _Var2 = borg_read_scroll(sv_scroll_satisfy_hunger);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_activate_item(act_satisfy);
                if (_Var2) {
                  return true;
                }
              }
              if ((borg.trait[0x1b] < borg.trait[0x1c] / 2) && ((int)uVar5 < 0x19)) {
                _Var2 = borg_zap_rod(sv_rod_healing);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_quaff_potion(sv_potion_cure_serious);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_quaff_crit(false);
                if (_Var2) {
                  return true;
                }
                _Var2 = borg_activate_item(act_cure_serious);
                if (_Var2) {
                  return true;
                }
              }
              pbVar1 = borg_items;
              if (borg.has[kv_rod_recall] == 0) {
                if (borg.has[kv_rod_healing] != 0) goto LAB_0022bac4;
              }
              else {
                if (borg.has[kv_rod_healing] == 0) {
LAB_0022baff:
                  pbVar1 = borg_items;
                  wVar6 = borg_slot(L'\x18',sv_rod_recall);
                  if (pbVar1[wVar6].pval != 0) goto LAB_0022bb75;
                }
                else {
LAB_0022bac4:
                  wVar6 = borg_slot(L'\x18',sv_rod_healing);
                  if (pbVar1[wVar6].pval != 0) {
                    if (borg.has[kv_rod_recall] == 0) goto LAB_0022bb75;
                    goto LAB_0022baff;
                  }
                }
                if (((((borg.trait[0x6c] == 0) && (borg.trait[0x74] == 0)) &&
                     (borg.trait[0x6d] == 0)) &&
                    ((borg.trait[0x73] == 0 && (_Var2 = borg_check_rest(borg.c.y,borg.c.x), _Var2)))
                    ) && (_Var2 = borg_spell_okay(RECHARGING), !_Var2)) {
                  borg_note("# Resting to recharge a rod...");
                  borg.time_this_panel = 0;
                  borg_keypress(0x52);
                  borg_keypress(0x31);
                  k = 0x30;
                  borg_keypress(0x30);
                  goto LAB_0022bd65;
                }
              }
LAB_0022bb75:
              if (((((borg.trait[0x70] != 0) || (borg.trait[0x73] != 0)) ||
                   ((borg.trait[0x74] != 0 || ((borg.trait[0x6c] != 0 || (borg.trait[0x6d] != 0)))))
                   ) || (((borg.trait[0x72] == 0 &&
                          ((((borg.trait[0x78] == 0 && (borg.trait[0x71] == 0)) &&
                            (borg.trait[0x75] == 0)) &&
                           (((borg.trait[0x76] == 0 && (borg.trait[0x1c] <= borg.trait[0x1b])) &&
                            ((int)((0x55 < borg.trait[0x69] | 6) * borg.trait[0x1f]) / 10 <=
                             borg.trait[0x1e])))))) ||
                         ((_Var2 = borg_check_rest(borg.c.y,borg.c.x), !_Var2 ||
                          (scaryguy_on_level != false)))))) ||
                 (((int)(uint)borg_fear_region[borg.c.y / 0xb][borg.c.x / 0xb] < wVar4 ||
                  (borg.goal.type == 9)))) {
                if (((((borg.trait[0x1f] == 0) ||
                      (((0x28 < borg.trait[0x23] && (borg.trait[0x69] < 0x55)) ||
                       ((borg.trait[0x1f] << 3) / 10 <= borg.trait[0x1e])))) ||
                     ((avoidance / 10 <= wVar4 ||
                      (_Var2 = borg_check_rest(borg.c.y,borg.c.x), !_Var2)))) ||
                    (borg.trait[0x6c] != 0)) ||
                   (((borg.trait[0x74] != 0 || (borg.trait[0x6d] != 0)) ||
                    ((borg.trait[0x73] != 0 ||
                     ((borg.trait[0x27] < 3 || (borg.munchkin_mode != false)))))))) {
                  if (((borg.trait[0x1f] != 0) &&
                      ((borg.munchkin_mode == true &&
                       ((((borg.trait[0x1e] < borg.trait[0x1f] ||
                          (borg.trait[0x1b] < borg.trait[0x1c])) &&
                         (_Var2 = borg_check_rest(borg.c.y,borg.c.x), _Var2)) &&
                        ((borg.trait[0x6c] == 0 && (borg.trait[0x74] == 0)))))))) &&
                     ((borg.trait[0x6d] == 0 &&
                      (((borg.trait[0x73] == 0 && (2 < borg.trait[0x27])) &&
                       ((byte)(borg_grids[borg.c.y][borg.c.x].feat - 5) < 2)))))) {
                    pcVar7 = "# Resting to gain munchkin HP/mana. (danger %d)...";
                    goto LAB_0022be59;
                  }
                  if ((borg.trait[0x70] == 0) || (borg.munchkin_mode != true)) {
                    return false;
                  }
                  pcVar7 = "# Resting to cure problem. (danger %d)...";
                }
                else {
                  pcVar7 = "# Resting to gain Mana. (danger %d)...";
LAB_0022be59:
                  pcVar7 = format(pcVar7,(ulong)(uint)wVar4);
                }
                borg_note(pcVar7);
                borg_keypress(0x52);
                k = 0x2a;
LAB_0022bd65:
                borg_keypress(k);
                borg_keypress(0x9c);
                borg.in_shop = false;
                return true;
              }
              _Var2 = borg_check_light_only();
              if (!_Var2) {
                pcVar7 = format("# Resting to recover HP/SP...");
                borg_note(pcVar7);
                borg_keypress(0x52);
                borg_keypress(0x26);
                borg_keypress(0x9c);
                borg.need_see_invis = borg_t + -0x32;
                borg.time_this_panel = 0;
                return true;
              }
              pcVar7 = "# Lighted the darkened room instead of resting.";
            }
            pcVar7 = format(pcVar7);
            goto LAB_0022b2b6;
          }
          pcVar7 = "# Cure fear - danger %d";
        }
        else {
          pcVar7 = "# Cure poison - danger %d";
        }
      }
      else {
        pcVar7 = "# Cure Cuts - danger %d";
      }
    }
    else {
      pcVar7 = "# Cure Heavy Stun - danger %d";
    }
  }
  else {
    pcVar7 = "# Cure Stun - danger %d";
  }
  pcVar7 = format(pcVar7,(ulong)(uint)wVar4);
LAB_0022b2b6:
  borg_note(pcVar7);
  return true;
}

Assistant:

bool borg_recover(void)
{
    int            p = 0;
    int            q;
    enum borg_need need;

    /*** Handle annoying situations ***/
    need = borg_maintain_light();
    if (need == BORG_MET_NEED)
        return true;
    else if (need == BORG_UNMET_NEED)
        borg_note(format("# Need to refuel but cant!"));

    /*** Do not recover when in danger ***/

    /* Look around for danger */
    p = borg_danger(borg.c.y, borg.c.x, 1, true, false);

    /* Never recover in dangerous situations */
    if (p > avoidance / 4)
        return false;

    /*** Roll for "paranoia" ***/

    /* Base roll */
    q = randint0(100);

    /* Half dead */
    if (borg.trait[BI_CURHP] < borg.trait[BI_MAXHP] / 2)
        q = q - 10;

    /* Almost dead */
    if (borg.trait[BI_CURHP] < borg.trait[BI_MAXHP] / 4)
        q = q - 10;

    /*** Use "cheap" cures ***/

    /* Hack -- cure stun */
    if (borg.trait[BI_ISSTUN] && (q < 75)) {
        if (borg_activate_item(act_cure_body)
            || borg_activate_item(act_cure_critical)
            || borg_activate_item(act_cure_full)
            || borg_activate_item(act_cure_full2)
            || borg_activate_item(act_cure_temp)
            || borg_activate_item(act_heal3) || borg_spell(MINOR_HEALING)
            || borg_spell(HEALING) || borg_spell(HERBAL_CURING)
            || borg_spell(HOLY_WORD))

        {
            /* Take note */
            borg_note(format("# Cure Stun - danger %d", p));

            return true;
        }
    }

    /* Hack -- cure stun */
    if (borg.trait[BI_ISHEAVYSTUN]) {
        if (borg_eat(TV_MUSHROOM, sv_mush_fast_recovery)
            || borg_activate_item(act_cure_body)
            || borg_activate_item(act_cure_critical)
            || borg_activate_item(act_cure_full)
            || borg_activate_item(act_cure_full2)
            || borg_activate_item(act_cure_temp)
            || borg_activate_item(act_heal3) || borg_spell(MINOR_HEALING)
            || borg_spell(HEALING) || borg_spell(HERBAL_CURING)
            || borg_spell(HOLY_WORD)) {
            /* Take note */
            borg_note(format("# Cure Heavy Stun - danger %d", p));

            return true;
        }
    }

    /* Hack -- cure cuts */
    if (borg.trait[BI_ISCUT] && (q < 75)) {
        if (borg_activate_item(act_cure_light) || borg_spell(MINOR_HEALING)
            || borg_spell(HEALING) || borg_spell(HERBAL_CURING)
            || borg_spell(HOLY_WORD)) {
            /* Take note */
            borg_note(format("# Cure Cuts - danger %d", p));

            return true;
        }
    }

    /* Hack -- cure poison */
    if (borg.trait[BI_ISPOISONED] && (q < 75)) {
        if (borg_eat(TV_MUSHROOM, sv_mush_fast_recovery)
            || borg_activate_item(act_rem_fear_pois)
            || borg_spell(HERBAL_CURING) || borg_spell(CURE_POISON)) {
            /* Take note */
            borg_note(format("# Cure poison - danger %d", p));

            return true;
        }
    }

    /* Hack -- cure fear */
    if (borg.trait[BI_ISAFRAID] && !borg.trait[BI_CRSFEAR] && (q < 75)) {
        if (borg_eat(TV_MUSHROOM, sv_mush_cure_mind)
            || borg_activate_item(act_rem_fear_pois) || borg_spell(HEROISM)
            || borg_spell(BERSERK_STRENGTH) || borg_spell(HOLY_WORD)) {
            /* Take note */
            borg_note(format("# Cure fear - danger %d", p));

            return true;
        }
    }

    /* Hack -- satisfy hunger */
    if ((borg.trait[BI_ISHUNGRY] || borg.trait[BI_ISWEAK]) && (q < 75)) {
        if (borg_spell(REMOVE_HUNGER) || borg_spell(HERBAL_CURING)) {
            return true;
        }
    }

    /* Hack -- hallucination */
    if (borg.trait[BI_ISIMAGE] && (q < 75)) {
        if (borg_eat(TV_MUSHROOM, sv_mush_cure_mind)) {
            return true;
        }
    }

    /* Hack -- heal damage */
    if ((borg.trait[BI_CURHP] < borg.trait[BI_MAXHP] / 2) && (q < 75) && p == 0
        && (borg.trait[BI_CURSP] > borg.trait[BI_MAXSP] / 4)) {
        if (borg_activate_item(act_heal1) || borg_activate_item(act_heal2)
            || borg_activate_item(act_heal3) || borg_spell(HEALING)
            || borg_spell(HOLY_WORD) || borg_spell(MINOR_HEALING)
            || borg_spell(HEROISM)) {
            /* Take note */
            borg_note(format("# heal damage (recovering)"));

            return true;
        }
    }

    /* cure experience loss with prayer */
    if (borg.trait[BI_ISFIXEXP]
        && (borg_activate_item(act_restore_exp)
            || borg_activate_item(act_restore_st_lev)
            || borg_activate_item(act_restore_life) || borg_spell(REVITALIZE)
            || borg_spell(REMEMBRANCE)
            || (borg.trait[BI_CURHP] > 90 && borg_spell(UNHOLY_REPRIEVE)))) {
        return true;
    }

    /* cure stat drain with prayer */
    if ((borg.trait[BI_ISFIXSTR] || borg.trait[BI_ISFIXINT]
            || borg.trait[BI_ISFIXWIS] || borg.trait[BI_ISFIXDEX]
            || borg.trait[BI_ISFIXCON] || borg.trait[BI_ISFIXALL])
        && (borg_spell(RESTORATION) || borg_spell(REVITALIZE))) {
        return true;
    }

    /* cure stat drain with prayer */
    if ((borg.trait[BI_ISFIXSTR] || borg.trait[BI_ISFIXINT]
            || borg.trait[BI_ISFIXCON])
        && borg.trait[BI_CURHP] > 90 && borg_spell(UNHOLY_REPRIEVE)) {
        return true;
    }

    /*** Use "expensive" cures ***/

    /* Hack -- cure stun */
    if (borg.trait[BI_ISSTUN] && (q < 25)) {
        if (borg_use_staff_fail(sv_staff_curing) || borg_zap_rod(sv_rod_curing)
            || borg_zap_rod(sv_rod_healing) || borg_activate_item(act_heal1)
            || borg_activate_item(act_heal2) || borg_quaff_crit(false)) {
            return true;
        }
    }

    /* Hack -- cure heavy stun */
    if (borg.trait[BI_ISHEAVYSTUN] && (q < 95)) {
        if (borg_quaff_crit(true) || borg_use_staff_fail(sv_staff_curing)
            || borg_zap_rod(sv_rod_curing) || borg_zap_rod(sv_rod_healing)
            || borg_activate_item(act_heal1) || borg_activate_item(act_heal2)) {
            return true;
        }
    }

    /* Hack -- cure cuts */
    if (borg.trait[BI_ISCUT] && (q < 25)) {
        if (borg_use_staff_fail(sv_staff_curing) || borg_zap_rod(sv_rod_curing)
            || borg_zap_rod(sv_rod_healing) || borg_activate_item(act_heal1)
            || borg_activate_item(act_heal2)
            || borg_quaff_crit(borg.trait[BI_CURHP] < 10)) {
            return true;
        }
    }

    /* Hack -- cure poison */
    if (borg.trait[BI_ISPOISONED] && (q < 25)) {
        if (borg_eat(TV_MUSHROOM, sv_mush_fast_recovery)
            || borg_quaff_potion(sv_potion_cure_poison)
            || borg_eat(TV_FOOD, sv_food_waybread)
            || borg_eat(TV_MUSHROOM, sv_mush_fast_recovery)
            || borg_quaff_crit(borg.trait[BI_CURHP] < 10)
            || borg_use_staff_fail(sv_staff_curing)
            || borg_zap_rod(sv_rod_curing)
            || borg_activate_item(act_rem_fear_pois)
            || borg_activate_item(act_food_waybread)) {
            return true;
        }
    }

    /* Hack -- cure blindness */
    if (borg.trait[BI_ISBLIND] && (q < 25)) {
        if (borg_eat(TV_MUSHROOM, sv_mush_fast_recovery)
            || borg_eat(TV_FOOD, sv_food_waybread)
            || borg_quaff_potion(sv_potion_cure_light)
            || borg_quaff_potion(sv_potion_cure_serious)
            || borg_quaff_crit(false) || borg_use_staff_fail(sv_staff_curing)
            || borg_zap_rod(sv_rod_curing)
            || borg_activate_item(act_food_waybread)) {
            return true;
        }
    }

    /* Hack -- cure confusion */
    if (borg.trait[BI_ISCONFUSED] && (q < 25)) {
        if (borg_eat(TV_MUSHROOM, sv_mush_cure_mind)
            || borg_quaff_potion(sv_potion_cure_serious)
            || borg_quaff_crit(false) || borg_use_staff_fail(sv_staff_curing)
            || borg_activate_item(act_cure_confusion)
            || borg_zap_rod(sv_rod_curing)) {
            return true;
        }
    }

    /* Hack -- cure fear */
    if (borg.trait[BI_ISAFRAID] && !borg.trait[BI_CRSFEAR] && (q < 25)) {
        if (borg_eat(TV_MUSHROOM, sv_mush_cure_mind)
            || borg_quaff_potion(sv_potion_boldness)
            || borg_quaff_potion(sv_potion_heroism)
            || borg_quaff_potion(sv_potion_berserk)
            || borg_activate_item(act_rem_fear_pois)) {
            return true;
        }
    }

    /* Hack -- satisfy hunger */
    if ((borg.trait[BI_ISHUNGRY] || borg.trait[BI_ISWEAK]) && (q < 25)) {
        if (borg_read_scroll(sv_scroll_satisfy_hunger)
            || borg_activate_item(act_satisfy)) {
            return true;
        }
    }

    /* Hack -- heal damage */
    if ((borg.trait[BI_CURHP] < borg.trait[BI_MAXHP] / 2) && (q < 25)) {
        if (borg_zap_rod(sv_rod_healing)
            || borg_quaff_potion(sv_potion_cure_serious)
            || borg_quaff_crit(false) || borg_activate_item(act_cure_serious)) {
            return true;
        }
    }

    /* Hack -- Rest to recharge Rods of Healing or Recall*/
    if (borg.has[kv_rod_recall] || borg.has[kv_rod_healing]) {
        /* Step 1.  Recharge just 1 rod. */
        if ((borg.has[kv_rod_healing]
                && !borg_items[borg_slot(TV_ROD, sv_rod_healing)].pval)
            || (borg.has[kv_rod_recall]
                && !borg_items[borg_slot(TV_ROD, sv_rod_recall)].pval)) {
            /* Mages can cast the recharge spell */

            /* Rest until at least one recharges */
            if (!borg.trait[BI_ISWEAK] && !borg.trait[BI_ISCUT]
                && !borg.trait[BI_ISHUNGRY] && !borg.trait[BI_ISPOISONED]
                && borg_check_rest(borg.c.y, borg.c.x)
                && !borg_spell_okay(RECHARGING)) {
                /* Take note */
                borg_note("# Resting to recharge a rod...");

                /* Reset the Bouncing-borg Timer */
                borg.time_this_panel = 0;

                /* Rest until done */
                borg_keypress('R');
                borg_keypress('1');
                borg_keypress('0');
                borg_keypress('0');
                borg_keypress(KC_ENTER);

                /* I'm not in a store */
                borg.in_shop = false;

                /* Done */
                return true;
            }
        }
    }

    /*** Just Rest ***/

    /* Hack -- rest until healed */
    if (!borg.trait[BI_ISBLIND] && !borg.trait[BI_ISPOISONED]
        && !borg.trait[BI_ISCUT] && !borg.trait[BI_ISWEAK]
        && !borg.trait[BI_ISHUNGRY]
        && (borg.trait[BI_ISCONFUSED] || borg.trait[BI_ISIMAGE]
            || borg.trait[BI_ISAFRAID] || borg.trait[BI_ISSTUN]
            || borg.trait[BI_ISHEAVYSTUN]
            || borg.trait[BI_CURHP] < borg.trait[BI_MAXHP]
            || borg.trait[BI_CURSP] < borg.trait[BI_MAXSP]
                                          * (borg.trait[BI_CDEPTH] > 85 ? 7 : 6)
                                          / 10)) {
        if (borg_check_rest(borg.c.y, borg.c.x) && !scaryguy_on_level
            && p <= borg_fear_region[borg.c.y / 11][borg.c.x / 11]
            && borg.goal.type != GOAL_RECOVER) {

            /* check for then call lite in dark room before resting */
            if (!borg_check_light_only()) {
                /* Take note */
                borg_note(format("# Resting to recover HP/SP..."));

                /* Rest until done */
                borg_keypress('R');
                borg_keypress('&');
                borg_keypress(KC_ENTER);

                /* Reset our panel clock, we need to be here */
                borg.time_this_panel = 0;

                /* reset the inviso clock to avoid loops */
                borg.need_see_invis = borg_t - 50;

                /* Done */
                return true;
            } else {
                /* Must have been a dark room */
                borg_note(
                    format("# Lighted the darkened room instead of resting."));
                return true;
            }
        }
    }

    /* Hack to recharge mana if a low level mage or priest */
    if (borg.trait[BI_MAXSP]
        && (borg.trait[BI_CLEVEL] <= 40 || borg.trait[BI_CDEPTH] >= 85)
        && borg.trait[BI_CURSP] < (borg.trait[BI_MAXSP] * 8 / 10)
        && p < avoidance * 1 / 10 && borg_check_rest(borg.c.y, borg.c.x)) {
        if (!borg.trait[BI_ISWEAK] && !borg.trait[BI_ISCUT]
            && !borg.trait[BI_ISHUNGRY] && !borg.trait[BI_ISPOISONED]
            && borg.trait[BI_FOOD] > 2 && !borg.munchkin_mode) {
            /* Take note */
            borg_note(format("# Resting to gain Mana. (danger %d)...", p));

            /* Rest until done */
            borg_keypress('R');
            borg_keypress('*');
            borg_keypress(KC_ENTER);

            /* I'm not in a store */
            borg.in_shop = false;

            /* Done */
            return true;
        }
    }

    /* Hack to recharge mana if a low level mage in munchkin mode */
    if (borg.trait[BI_MAXSP] && borg.munchkin_mode == true
        && (borg.trait[BI_CURSP] < borg.trait[BI_MAXSP]
            || borg.trait[BI_CURHP] < borg.trait[BI_MAXHP])
        && borg_check_rest(borg.c.y, borg.c.x)) {
        if (!borg.trait[BI_ISWEAK] && !borg.trait[BI_ISCUT]
            && !borg.trait[BI_ISHUNGRY] && !borg.trait[BI_ISPOISONED]
            && borg.trait[BI_FOOD] > 2
            && (borg_grids[borg.c.y][borg.c.x].feat == FEAT_MORE
                || borg_grids[borg.c.y][borg.c.x].feat == FEAT_LESS)) {
            /* Take note */
            borg_note(format(
                "# Resting to gain munchkin HP/mana. (danger %d)...", p));

            /* Rest until done */
            borg_keypress('R');
            borg_keypress('*');
            borg_keypress(KC_ENTER);

            /* I'm not in a store */
            borg.in_shop = false;

            /* Done */
            return true;
        }
    }

    /* Hack to heal blindness if in munchkin mode */
    if (borg.trait[BI_ISBLIND] && borg.munchkin_mode == true) {
        /* Take note */
        borg_note("# Resting to cure problem. (danger %d)...");

        /* Rest until done */
        borg_keypress('R');
        borg_keypress('*');
        borg_keypress(KC_ENTER);

        /* I'm not in a store */
        borg.in_shop = false;

        /* Done */
        return true;
    }

    /* Nope */
    return false;
}